

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O2

string * nivalis::nivalis_to_latex(string *__return_storage_ptr__,string *expr_in,Environment *env)

{
  int iVar1;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string copy;
  Expr expr;
  ostringstream strm;
  
  s = expr_in;
  std::__cxx11::string::string((string *)&copy,(string *)expr_in);
  util::trim((util *)&copy,s);
  if (copy._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&strm);
  }
  else if (*copy._M_dataplus._M_p == '#') {
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&copy);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&strm,
                   "\\text{",&local_1f0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&strm,"}");
    std::__cxx11::string::~string((string *)&strm);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    parse(&expr,expr_in,env,false,true,0,(string *)0x0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&strm);
    Expr::latex_repr(&expr,(ostream *)&strm,env);
    std::__cxx11::stringbuf::str();
    if (0xc < __return_storage_ptr__->_M_string_length) {
      iVar1 = std::__cxx11::string::compare((ulong)__return_storage_ptr__,0,(char *)0x6);
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::string::compare
                          ((ulong)__return_storage_ptr__,
                           __return_storage_ptr__->_M_string_length - 7,(char *)0x7);
        if (iVar1 == 0) {
          std::__cxx11::string::substr((ulong)&local_1f0,(ulong)__return_storage_ptr__);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&strm);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &expr);
  }
  std::__cxx11::string::~string((string *)&copy);
  return __return_storage_ptr__;
}

Assistant:

std::string nivalis_to_latex(const std::string& expr_in, Environment& env) {
    std::string copy = expr_in;
    util::trim(copy);
    if (copy.empty()) return "";
    if (copy[0] == '#') return "\\text{" + copy.substr(1) + "}";
    Expr expr = parse(expr_in, env, false, true);

    std::ostringstream strm;
    expr.latex_repr(strm, env);
    std::string s = strm.str();
    if (s.size() >= 13 &&
            s.compare(0, 6, "\\left(") == 0 &&
            s.compare(s.size() - 7, 7, "\\right)") == 0) {
        s = s.substr(6, s.size() - 13);
    }
    return s;
}